

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticQuad>::PrintTopologicalInfo
          (TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *this,ostream *out)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  TPZGeoNode *this_00;
  ostream *in_RSI;
  TPZNodeRep<8,_pztopology::TPZQuadrilateral> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_40;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar3 = std::operator<<(in_RSI,"Geo Element - fId ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->fNodeIndexes[1]);
  poVar3 = std::operator<<(poVar3,"\t Type ");
  pzgeom::TPZQuadraticQuad::TypeName_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,"\t");
  std::__cxx11::string::~string(local_30);
  pzgeom::TPZNodeRep<8,_pztopology::TPZQuadrilateral>::Print
            (in_RDI,(ostream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  poVar3 = (ostream *)std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar3,"\t");
  local_40 = 0;
  while( true ) {
    iVar2 = local_40;
    iVar1 = (*(in_RDI->super_TPZQuadrilateral).super_TPZSavable._vptr_TPZSavable[0x12])();
    poVar3 = local_10;
    if (iVar1 <= iVar2) break;
    this_00 = TPZGeoEl::NodePtr((TPZGeoEl *)in_RDI,iVar2);
    iVar2 = TPZGeoNode::Id(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3," ");
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

virtual void PrintTopologicalInfo(std::ostream &out) override
	{
		out << "Geo Element - fId " << fId << "\t Type " << fGeo.TypeName() << "\t";
		fGeo.Print(out);
		int i;
		out << std::endl << "\t";
		for (i = 0;i < NNodes();i++) out << NodePtr(i)->Id() << " ";
	}